

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3a28a9::BNTest_ASC2BN_Test::TestBody(BNTest_ASC2BN_Test *this)

{
  _Alloc_hider _Var1;
  int iVar2;
  char *in_R9;
  AssertHelper local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  string local_50;
  UniquePtr<BIGNUM> bn;
  AssertionResult gtest_ar_;
  
  ASCIIToBIGNUM((anon_unknown_dwarf_3a28a9 *)&bn,"0");
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
       bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
      bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4b65fc,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x4ba,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar2 = BN_is_zero((BIGNUM *)
                       bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar2 != 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_50,(internal *)&gtest_ar_,(AssertionResult *)"BN_is_zero(bn.get())","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4bb,local_50._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      std::__cxx11::string::~string((string *)&local_50);
      if (local_58._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar2 = BN_is_negative((BIGNUM *)
                           bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar2 == 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4b650b,"true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4bc,local_50._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      std::__cxx11::string::~string((string *)&local_50);
      if (local_58._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    ASCIIToBIGNUM((anon_unknown_dwarf_3a28a9 *)&local_50,"256");
    _Var1._M_p = local_50._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> *)&bn,(pointer)_Var1._M_p);
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_50);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
         bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
        bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4b65fc,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4bf,local_50._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      iVar2 = BN_is_word((BIGNUM *)
                         bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0x100);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar2 != 0;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)&local_58);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_50,(internal *)&gtest_ar_,(AssertionResult *)"BN_is_word(bn.get(), 256)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x4c0,local_50._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        std::__cxx11::string::~string((string *)&local_50);
        if (local_58._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_58._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      iVar2 = BN_is_negative((BIGNUM *)
                             bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar2 == 0;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)&local_58);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4b650b,"true","false",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x4c1,local_50._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        std::__cxx11::string::~string((string *)&local_50);
        if (local_58._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_58._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      ASCIIToBIGNUM((anon_unknown_dwarf_3a28a9 *)&local_50,"-42");
      _Var1._M_p = local_50._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)0x0;
      std::__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> *)&bn,(pointer)_Var1._M_p);
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_50);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
           bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
      if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
          bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&local_58);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4b65fc,"false","true",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x4c4,local_50._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar2 = BN_abs_is_word((BIGNUM *)
                               bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0x2a);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar2 != 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_58);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,(internal *)&gtest_ar_,
                     (AssertionResult *)"BN_abs_is_word(bn.get(), 42)","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x4c5,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          std::__cxx11::string::~string((string *)&local_50);
          if (local_58._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_58._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar2 = BN_is_negative((BIGNUM *)
                               bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar2 != 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_58);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4b650b,"false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x4c6,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          std::__cxx11::string::~string((string *)&local_50);
          if (local_58._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_58._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ASCIIToBIGNUM((anon_unknown_dwarf_3a28a9 *)&local_50,"0x1234");
        _Var1._M_p = local_50._M_dataplus._M_p;
        local_50._M_dataplus._M_p = (pointer)0x0;
        std::__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> *)&bn,(pointer)_Var1._M_p);
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_50);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
             bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
            bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&local_58);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4b65fc,"false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x4c9,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          iVar2 = BN_is_word((BIGNUM *)
                             bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0x1234);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ = iVar2 != 0;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&local_58);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_50,(internal *)&gtest_ar_,
                       (AssertionResult *)"BN_is_word(bn.get(), 0x1234)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x4ca,local_50._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
            testing::internal::AssertHelper::~AssertHelper(&local_60);
            std::__cxx11::string::~string((string *)&local_50);
            if (local_58._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_58._M_head_impl + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          iVar2 = BN_is_negative((BIGNUM *)
                                 bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ = iVar2 == 0;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&local_58);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4b650b,"true","false",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x4cb,local_50._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
            testing::internal::AssertHelper::~AssertHelper(&local_60);
            std::__cxx11::string::~string((string *)&local_50);
            if (local_58._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_58._M_head_impl + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          ASCIIToBIGNUM((anon_unknown_dwarf_3a28a9 *)&local_50,"0X1234");
          _Var1._M_p = local_50._M_dataplus._M_p;
          local_50._M_dataplus._M_p = (pointer)0x0;
          std::__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> *)&bn,(pointer)_Var1._M_p)
          ;
          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_50);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ =
               (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
               bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
               (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
          if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
              bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
            testing::Message::Message((Message *)&local_58);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4b65fc,"false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x4ce,local_50._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            iVar2 = BN_is_word((BIGNUM *)
                               bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0x1234);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ = iVar2 != 0;
            if (!gtest_ar_.success_) {
              testing::Message::Message((Message *)&local_58);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_50,(internal *)&gtest_ar_,
                         (AssertionResult *)"BN_is_word(bn.get(), 0x1234)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_60,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x4cf,local_50._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
              testing::internal::AssertHelper::~AssertHelper(&local_60);
              std::__cxx11::string::~string((string *)&local_50);
              if (local_58._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_58._M_head_impl + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            iVar2 = BN_is_negative((BIGNUM *)
                                   bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ = iVar2 == 0;
            if (!gtest_ar_.success_) {
              testing::Message::Message((Message *)&local_58);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4b650b,"true","false"
                         ,in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_60,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x4d0,local_50._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
              testing::internal::AssertHelper::~AssertHelper(&local_60);
              std::__cxx11::string::~string((string *)&local_50);
              if (local_58._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_58._M_head_impl + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            ASCIIToBIGNUM((anon_unknown_dwarf_3a28a9 *)&local_50,"-0xabcd");
            _Var1._M_p = local_50._M_dataplus._M_p;
            local_50._M_dataplus._M_p = (pointer)0x0;
            std::__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> *)&bn,
                       (pointer)_Var1._M_p);
            std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_50);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ =
                 (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                 bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                 (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
            if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
                (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
              testing::Message::Message((Message *)&local_58);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4b65fc,"false","true"
                         ,in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_60,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x4d3,local_50._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              iVar2 = BN_abs_is_word((BIGNUM *)
                                     bn._M_t.
                                     super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0xabcd);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar_.success_ = iVar2 != 0;
              if (!gtest_ar_.success_) {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_50,(internal *)&gtest_ar_,
                           (AssertionResult *)"BN_abs_is_word(bn.get(), 0xabcd)","false","true",
                           in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_60,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x4d4,local_50._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_60);
                std::__cxx11::string::~string((string *)&local_50);
                if (local_58._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_58._M_head_impl + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              iVar2 = BN_is_negative((BIGNUM *)
                                     bn._M_t.
                                     super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar_.success_ = iVar2 != 0;
              if (!gtest_ar_.success_) {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_50,(internal *)&gtest_ar_,
                           (AssertionResult *)"!BN_is_negative(bn.get())","true","false",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_60,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x4d5,local_50._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_60);
                std::__cxx11::string::~string((string *)&local_50);
                if (local_58._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_58._M_head_impl + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              ASCIIToBIGNUM((anon_unknown_dwarf_3a28a9 *)&local_50,"-0");
              _Var1._M_p = local_50._M_dataplus._M_p;
              local_50._M_dataplus._M_p = (pointer)0x0;
              std::__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>::reset
                        ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> *)&bn,
                         (pointer)_Var1._M_p);
              std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_50);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar_.success_ =
                   (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                   bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                   (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
              if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                  bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
                  (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4b65fc,"false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_60,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x4d8,local_50._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                iVar2 = BN_is_zero((BIGNUM *)
                                   bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ = iVar2 != 0;
                if (!gtest_ar_.success_) {
                  testing::Message::Message((Message *)&local_58);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_50,(internal *)&gtest_ar_,
                             (AssertionResult *)"BN_is_zero(bn.get())","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_60,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x4d9,local_50._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
                  testing::internal::AssertHelper::~AssertHelper(&local_60);
                  std::__cxx11::string::~string((string *)&local_50);
                  if (local_58._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_58._M_head_impl + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                iVar2 = BN_is_negative((BIGNUM *)
                                       bn._M_t.
                                       super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ = iVar2 == 0;
                if (!gtest_ar_.success_) {
                  testing::Message::Message((Message *)&local_58);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4b650b,"true",
                             "false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_60,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x4da,local_50._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
                  testing::internal::AssertHelper::~AssertHelper(&local_60);
                  std::__cxx11::string::~string((string *)&local_50);
                  if (local_58._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_58._M_head_impl + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                ASCIIToBIGNUM((anon_unknown_dwarf_3a28a9 *)&local_50,
                              "123trailing garbage is ignored");
                _Var1._M_p = local_50._M_dataplus._M_p;
                local_50._M_dataplus._M_p = (pointer)0x0;
                std::__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> *)&bn,
                           (pointer)_Var1._M_p);
                std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_50);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ =
                     (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                     bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                     (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
                if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                    bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
                    (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                  testing::Message::Message((Message *)&local_58);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4b65fc,"false",
                             "true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_60,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x4dd,local_50._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
                }
                else {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  iVar2 = BN_is_word((BIGNUM *)
                                     bn._M_t.
                                     super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0x7b);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar2 != 0;
                  if (!gtest_ar_.success_) {
                    testing::Message::Message((Message *)&local_58);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_50,(internal *)&gtest_ar_,
                               (AssertionResult *)"BN_is_word(bn.get(), 123)","false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_60,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x4de,local_50._M_dataplus._M_p);
                    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
                    testing::internal::AssertHelper::~AssertHelper(&local_60);
                    std::__cxx11::string::~string((string *)&local_50);
                    if (local_58._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_58._M_head_impl + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  iVar2 = BN_is_negative((BIGNUM *)
                                         bn._M_t.
                                         super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar2 == 0;
                  if (gtest_ar_.success_) goto LAB_0027bd70;
                  testing::Message::Message((Message *)&local_58);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4b650b,"true",
                             "false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_60,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x4df,local_50._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  std::__cxx11::string::~string((string *)&local_50);
  if (local_58._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_58._M_head_impl + 8))();
  }
LAB_0027bd70:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&bn);
  return;
}

Assistant:

TEST_F(BNTest, ASC2BN) {
  bssl::UniquePtr<BIGNUM> bn = ASCIIToBIGNUM("0");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_zero(bn.get()));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("256");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_word(bn.get(), 256));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("-42");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_abs_is_word(bn.get(), 42));
  EXPECT_TRUE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("0x1234");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_word(bn.get(), 0x1234));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("0X1234");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_word(bn.get(), 0x1234));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("-0xabcd");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_abs_is_word(bn.get(), 0xabcd));
  EXPECT_FALSE(!BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("-0");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_zero(bn.get()));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("123trailing garbage is ignored");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_word(bn.get(), 123));
  EXPECT_FALSE(BN_is_negative(bn.get()));
}